

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Environmental_Process_PDU::Environmental_Process_PDU
          (Environmental_Process_PDU *this,EntityIdentifier *EnvironmentalProcessID,
          EnvironmentType *ET,KUINT8 ModelType,KBOOL EnvironmentStatusLast,KBOOL EnvironmentStatusOn
          ,KUINT16 SequenceNumber,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
          *ERL)

{
  size_type sVar1;
  KBOOL EnvironmentStatusOn_local;
  KBOOL EnvironmentStatusLast_local;
  KUINT8 ModelType_local;
  EnvironmentType *ET_local;
  EntityIdentifier *EnvironmentalProcessID_local;
  Environmental_Process_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Environmental_Process_PDU_00330228;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EnvProcID,EnvironmentalProcessID);
  DATA_TYPE::EnvironmentType::EnvironmentType(&this->m_EnvType,ET);
  this->m_ui8ModelType = ModelType;
  (this->field_3).m_ui8EnvStatus = (this->field_3).m_ui8EnvStatus & 0xfe | EnvironmentStatusLast;
  (this->field_3).m_ui8EnvStatus =
       (this->field_3).m_ui8EnvStatus & 0xfd | EnvironmentStatusOn * '\x02';
  sVar1 = std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
          ::size(ERL);
  this->m_ui16NumEnvRec = (KUINT16)sVar1;
  this->m_ui16SeqNum = SequenceNumber;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ::vector(&this->m_vEnvRecords,ERL);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui8PDUType = ')';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Environmental_Process_PDU::Environmental_Process_PDU( const EntityIdentifier & EnvironmentalProcessID, const EnvironmentType & ET,
        KUINT8 ModelType, KBOOL EnvironmentStatusLast, KBOOL EnvironmentStatusOn,
        KUINT16 SequenceNumber, const vector<EnvironmentRecordPtr> & ERL ) :
    m_EnvProcID( EnvironmentalProcessID ),
    m_EnvType( ET ),
    m_ui8ModelType( ModelType ),
    m_ui8EnvStatusBit0( EnvironmentStatusLast ),
    m_ui8EnvStatusBit1( EnvironmentStatusOn ),
    m_ui16NumEnvRec( ERL.size() ),
    m_ui16SeqNum( SequenceNumber ),
    m_vEnvRecords( ERL )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8PDUType = EnvironmentalProcess_PDU_Type;
    m_ui16PDULength = ENVIROMENTAL_PROCESS_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}